

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::transactionAddedToMempool(CWallet *this,CTransactionRef *tx)

{
  base_blob<256U> *a;
  element_type *peVar1;
  pointer pCVar2;
  bool bVar3;
  iterator iVar4;
  Chain *chain;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var5;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  pointer __k;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  undefined1 local_68 [24];
  code *local_50;
  __index_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock26,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x597,false);
  local_40 = '\x01';
  SyncTransaction(this,tx,(SyncTxState *)local_68,true,false);
  iVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,
                 &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->hash).m_wrapped);
  if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    chain = CWallet::chain(this);
    RefreshMempoolStatus
              ((CWalletTx *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x28),chain);
  }
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__k = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start; __k != pCVar2; __k = __k + 1) {
    pVar6 = std::
            _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range(&(this->mapTxSpends)._M_h,&__k->prevout);
    for (_Var5._M_cur = (__node_type *)
                        pVar6.first.
                        super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur
        ; (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var5._M_cur !=
          pVar6.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur.
          super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
        _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
      a = (base_blob<256U> *)
          ((long)&((_Var5._M_cur)->
                  super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                  super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                  _M_storage + 0x24);
      bVar3 = ::operator==(a,(base_blob<256U> *)&peVar1->hash);
      if (!bVar3) {
        local_68._8_8_ = 0;
        local_50 = std::
                   _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1447:65)>
                   ::_M_invoke;
        local_68._16_8_ =
             std::
             _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1447:65)>
             ::_M_manager;
        local_68._0_8_ = &peVar1->hash;
        RecursiveUpdateTxState(this,(WalletBatch *)0x0,(uint256 *)a,(TryUpdatingStateFn *)local_68);
        std::_Function_base::~_Function_base((_Function_base *)local_68);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock26.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::transactionAddedToMempool(const CTransactionRef& tx) {
    LOCK(cs_wallet);
    SyncTransaction(tx, TxStateInMempool{});

    auto it = mapWallet.find(tx->GetHash());
    if (it != mapWallet.end()) {
        RefreshMempoolStatus(it->second, chain());
    }

    const Txid& txid = tx->GetHash();

    for (const CTxIn& tx_in : tx->vin) {
        // For each wallet transaction spending this prevout..
        for (auto range = mapTxSpends.equal_range(tx_in.prevout); range.first != range.second; range.first++) {
            const uint256& spent_id = range.first->second;
            // Skip the recently added tx
            if (spent_id == txid) continue;
            RecursiveUpdateTxState(/*batch=*/nullptr, spent_id, [&txid](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
                return wtx.mempool_conflicts.insert(txid).second ? TxUpdate::CHANGED : TxUpdate::UNCHANGED;
            });
        }
    }
}